

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.h
# Opt level: O2

logic_t slang::SVInt::logicalImpl(SVInt *lhs,SVInt *rhs)

{
  logic_t lVar1;
  
  lVar1 = operator!(lhs);
  lVar1 = slang::operator||(lVar1,rhs);
  return (logic_t)lVar1.value;
}

Assistant:

inline logic_t SVInt::logicalImpl(const SVInt& lhs, const SVInt& rhs) {
    return !lhs || rhs;
}